

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

void __thiscall Bmp::save(Bmp *this,string *file)

{
  FILE *__s;
  ulong uVar1;
  int i_1;
  int iVar2;
  int i;
  long lVar3;
  ulong uVar4;
  
  __s = fopen((file->_M_dataplus)._M_p,"wb");
  fwrite(&this->m_bf,1,0xe,__s);
  fwrite(&this->m_bi,1,0x28,__s);
  uVar4 = (ulong)(uint)this->m_h;
  while (0 < (int)uVar4) {
    uVar4 = uVar4 - 1;
    for (lVar3 = 0; uVar1 = (ulong)this->m_w, lVar3 < (long)uVar1; lVar3 = lVar3 + 1) {
      fputc((int)(char)this->m_data[lVar3][uVar4].b,__s);
      fputc((int)(char)this->m_data[lVar3][uVar4].g,__s);
      fputc((int)(char)this->m_data[lVar3][uVar4].r,__s);
    }
    for (iVar2 = 0;
        iVar2 < (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 4);
        iVar2 = iVar2 + 1) {
      fputc(0,__s);
      uVar1 = (ulong)(uint)this->m_w;
    }
  }
  fclose(__s);
  return;
}

Assistant:

void Bmp::save(const std::string& file) const
{
    FILE* f = fopen(file.c_str(), "wb");

    fwrite(&m_bf, 1, sizeof(BITMAPFILEHEADER), f);
    fwrite(&m_bi, 1, sizeof(BITMAPINFOHEADER), f);
    for (int j = m_h - 1; j >= 0; j--)
    {
        for (int i = 0; i < m_w; i++)
        {
            fwrite(&m_data[i][j].b, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].g, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].r, 1, sizeof(byte), f);
        }
        for (int i = 0; i < m_w % 4; i++) fputc(0, f);
    }

    fclose(f);
}